

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ForwardTypeRestrictionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypeRestrictionSyntax,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  ForwardTypeRestrictionSyntax *pFVar11;
  
  pFVar11 = (ForwardTypeRestrictionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForwardTypeRestrictionSyntax *)this->endPtr < pFVar11 + 1) {
    pFVar11 = (ForwardTypeRestrictionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pFVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pFVar11->super_SyntaxNode).kind = ForwardTypeRestriction;
  (pFVar11->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pFVar11->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pFVar11->keyword1).kind = TVar3;
  (pFVar11->keyword1).field_0x2 = uVar4;
  (pFVar11->keyword1).numFlags = (NumericTokenFlags)NVar5.raw;
  (pFVar11->keyword1).rawLen = uVar6;
  (pFVar11->keyword1).info = pIVar1;
  (pFVar11->keyword2).kind = TVar7;
  (pFVar11->keyword2).field_0x2 = uVar8;
  (pFVar11->keyword2).numFlags = (NumericTokenFlags)NVar9.raw;
  (pFVar11->keyword2).rawLen = uVar10;
  (pFVar11->keyword2).info = pIVar2;
  return pFVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }